

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::__cxx11::string&&>>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          *args_1,tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                  *args_2)

{
  allocator_type *alloc;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  *args_local_2;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  *args_local_1;
  piecewise_construct_t *args_local;
  size_t i_local;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  alloc = raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::alloc_ref((raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this);
  hash_policy_traits<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,void>
  ::
  construct<std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::__cxx11::string&&>>
            (alloc,(slot_type *)(*(long *)(this + 8) + i * 8),args,args_1,args_2);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }